

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O2

Boxed_Value chaiscript::detail::const_var_impl<unsigned_long_long>(unsigned_long_long *t)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  shared_ptr<const_unsigned_long_long> local_20;
  
  std::make_shared<unsigned_long_long_const,unsigned_long_long_const&>
            ((unsigned_long_long *)&local_20);
  Boxed_Value::Object_Data::get<unsigned_long_long_const>((Object_Data *)t,&local_20,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<const_unsigned_long_long,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)t;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value const_var_impl(const T &t) {
      return Boxed_Value(std::make_shared<typename std::add_const<T>::type>(t));
    }